

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

int raviX_bitset_iterator_next(BitSetIterator *iter,size_t *nbit)

{
  ulong uVar1;
  bitset_el_t *pbVar2;
  ulong uVar3;
  size_t sVar4;
  bitset_el_t *addr;
  bitset_el_t el;
  size_t len;
  size_t curr_nel;
  size_t el_bits_num;
  size_t *nbit_local;
  BitSetIterator *iter_local;
  
  len = iter->nbit >> 6;
  uVar1 = iter->bitset->els_num;
  pbVar2 = iter->bitset->varr;
  do {
    if (uVar1 <= len) {
      return 0;
    }
    uVar3 = pbVar2[len];
    if (uVar3 != 0) {
      addr = (bitset_el_t *)(uVar3 >> ((byte)iter->nbit & 0x3f));
      while (addr != (bitset_el_t *)0x0) {
        if (((ulong)addr & 1) != 0) {
          sVar4 = iter->nbit;
          iter->nbit = sVar4 + 1;
          *nbit = sVar4;
          return 1;
        }
        addr = (bitset_el_t *)((ulong)addr >> 1);
        iter->nbit = iter->nbit + 1;
      }
    }
    len = len + 1;
    iter->nbit = len * 0x40;
  } while( true );
}

Assistant:

int raviX_bitset_iterator_next(BitSetIterator *iter, size_t *nbit) {
	const size_t el_bits_num = sizeof (bitset_el_t) * CHAR_BIT;
	size_t curr_nel = iter->nbit / el_bits_num, len = iter->bitset->els_num;
	bitset_el_t el, *addr = iter->bitset->varr;

	for (; curr_nel < len; curr_nel++, iter->nbit = curr_nel * el_bits_num)
		if ((el = addr[curr_nel]) != 0)
			for (el >>= iter->nbit % el_bits_num; el != 0; el >>= 1, iter->nbit++)
				if (el & 1) {
					*nbit = iter->nbit++;
					return true;
				}
	return false;
}